

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::StrPair::SetStr(StrPair *this,char *str,int flags)

{
  size_t sVar1;
  void *pvVar2;
  uint in_EDX;
  char *in_RSI;
  uint *in_RDI;
  size_t len;
  StrPair *in_stack_ffffffffffffffe0;
  
  Reset(in_stack_ffffffffffffffe0);
  sVar1 = strlen(in_RSI);
  pvVar2 = operator_new__(sVar1 + 1);
  *(void **)(in_RDI + 2) = pvVar2;
  memcpy(*(void **)(in_RDI + 2),in_RSI,sVar1 + 1);
  *(size_t *)(in_RDI + 4) = *(long *)(in_RDI + 2) + sVar1;
  *in_RDI = in_EDX | 0x200;
  return;
}

Assistant:

void StrPair::SetStr( const char* str, int flags )
{
    Reset();
    size_t len = strlen( str );
    _start = new char[ len+1 ];
    memcpy( _start, str, len+1 );
    _end = _start + len;
    _flags = flags | NEEDS_DELETE;
}